

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_buffer_block(CompilerHLSL *this,SPIRVariable *var)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  uint uVar4;
  SPIRType *type_00;
  size_type sVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  mapped_type *this_00;
  TypedID<(spirv_cross::Types)1> *pTVar8;
  string *psVar9;
  CompilerError *pCVar10;
  SPIRType *pSVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  TypedID<(spirv_cross::Types)0> *in_R9;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar12;
  char (*in_stack_fffffffffffffa38) [69];
  bool local_4d1;
  char *local_4a8;
  char *local_4a0;
  byte local_47c;
  byte local_479;
  bool local_451;
  string local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  undefined1 local_3c9;
  string local_3c8;
  char local_3a8 [32];
  string local_388;
  uint32_t local_364;
  uint32_t local_360;
  uint32_t failed_index_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  uint32_t local_334;
  spirv_cross local_330 [32];
  string local_310;
  undefined1 local_2f0 [8];
  string member_name;
  undefined1 local_2c8 [8];
  string backup_name;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end4;
  TypedID<(spirv_cross::Types)1> *__begin4;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range4;
  undefined1 local_280 [4];
  uint32_t i;
  uint32_t local_25c;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_258;
  undefined1 local_250;
  undefined1 local_241;
  string local_240;
  string local_220;
  uint32_t local_1fc;
  undefined1 local_1f8 [4];
  uint32_t failed_index;
  uint32_t local_1d4;
  string local_1d0 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1b0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1a8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1a0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_198;
  undefined1 local_190 [8];
  string buffer_name;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  char *local_108;
  string local_100;
  char *local_e0;
  string local_d8;
  undefined1 local_b8 [8];
  string type_name;
  anon_class_8_1_8991fb9c to_structuredbuffer_subtype_name;
  bool is_interlocked;
  bool is_coherent;
  undefined1 local_70 [7];
  bool is_readonly;
  Bitset flags;
  bool is_uav;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  local_451 = true;
  if (var->storage != StorageBuffer) {
    local_451 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(type_00->super_IVariant).self.id,BufferBlock);
  }
  flags.higher._M_h._M_single_bucket._4_4_ =
       TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  sVar5 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&(this->super_CompilerGLSL).flattened_buffer_blocks,
                  (key_type *)((long)&flags.higher._M_h._M_single_bucket + 4));
  if (sVar5 == 0) {
    if (local_451 == false) {
      bVar1 = VectorView<unsigned_int>::empty(&(type_00->array).super_VectorView<unsigned_int>);
      if (bVar1) {
        buffer_name.field_2._12_4_ =
             TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        pmVar6 = ::std::
                 unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                 ::operator[](&(this->super_CompilerGLSL).flattened_structs,
                              (key_type *)(buffer_name.field_2._M_local_buf + 0xc));
        *pmVar6 = false;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_190,this,(ulong)uVar3,0);
        ::std::
        unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
        ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                     &(type_00->super_IVariant).self);
        bVar2 = ::std::__cxx11::string::empty();
        local_4d1 = true;
        if ((bVar2 & 1) == 0) {
          local_198._M_cur =
               (__node_type *)
               ::std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(this->super_CompilerGLSL).resource_names,(key_type *)local_190);
          local_1a0._M_cur =
               (__node_type *)
               ::std::
               end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                         (&(this->super_CompilerGLSL).resource_names);
          bVar1 = ::std::__detail::operator!=(&local_198,&local_1a0);
          local_4d1 = true;
          if (!bVar1) {
            local_1a8._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&(this->super_CompilerGLSL).block_names,(key_type *)local_190);
            local_1b0._M_cur =
                 (__node_type *)
                 ::std::
                 end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                           (&(this->super_CompilerGLSL).block_names);
            local_4d1 = ::std::__detail::operator!=(&local_1a8,&local_1b0);
          }
        }
        if (local_4d1 != false) {
          local_1d4 = (uint32_t)
                      TypedID::operator_cast_to_TypedID((TypedID *)&(var->super_IVariant).self);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[4])
                    (local_1d0,this,(ulong)local_1d4);
          ::std::__cxx11::string::operator=((string *)local_190,local_1d0);
          ::std::__cxx11::string::~string(local_1d0);
        }
        CompilerGLSL::add_variable
                  (&this->super_CompilerGLSL,&(this->super_CompilerGLSL).block_names,
                   &(this->super_CompilerGLSL).resource_names,(string *)local_190);
        uVar7 = ::std::__cxx11::string::empty();
        if ((uVar7 & 1) != 0) {
          uVar3 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(var->super_IVariant).field_0xc);
          pSVar11 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
          join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                    ((string *)local_1f8,(spirv_cross *)0x66305e,
                     (char (*) [2])&(pSVar11->super_IVariant).self,
                     (TypedID<(spirv_cross::Types)0> *)0x66305e,
                     (char (*) [2])&(var->super_IVariant).self,in_R9);
          ::std::__cxx11::string::operator=((string *)local_190,(string *)local_1f8);
          ::std::__cxx11::string::~string((string *)local_1f8);
        }
        local_1fc = 0;
        ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        bVar1 = CompilerGLSL::buffer_is_packing_standard
                          (&this->super_CompilerGLSL,type_00,BufferPackingHLSLCbufferPackOffset,
                           &local_1fc,0,0xffffffff);
        if (!bVar1) {
          local_241 = 1;
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&local_240,&this->super_CompilerGLSL,type_00,local_1fc);
          join<char_const(&)[12],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string&,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
                    (&local_220,(spirv_cross *)0x662902,(char (*) [12])&(var->super_IVariant).self,
                     (TypedID<(spirv_cross::Types)0> *)" (name: ",(char (*) [9])local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "), member index ",(char (*) [17])&local_1fc,(uint *)" (name: ",
                     (char (*) [9])&local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ") cannot be expressed with either HLSL packing layout or packoffset.",
                     in_stack_fffffffffffffa38);
          CompilerError::CompilerError(pCVar10,&local_220);
          local_241 = 0;
          __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        Compiler::set_extended_decoration
                  ((Compiler *)this,uVar3,SPIRVCrossDecorationExplicitOffset,0);
        pVar12 = ::std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert(&(this->super_CompilerGLSL).block_names,(value_type *)local_190);
        local_258._M_cur =
             (__node_type *)
             pVar12.first.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur;
        local_250 = pVar12.second;
        local_25c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        this_00 = ::std::
                  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&(this->super_CompilerGLSL).super_Compiler.declared_block_names,
                               &local_25c);
        ::std::__cxx11::string::operator=((string *)this_00,(string *)local_190);
        ::std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&type_00->member_name_cache);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        CompilerGLSL::preserve_alias_on_reset(&this->super_CompilerGLSL,uVar3);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar3);
        to_resource_binding_abi_cxx11_((string *)local_280,this,var);
        CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
                  (&this->super_CompilerGLSL,(char (*) [9])"cbuffer ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
        ::std::__cxx11::string::~string((string *)local_280);
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        __range4._4_4_ = 0;
        __end4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                           (&(type_00->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
        pTVar8 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                           (&(type_00->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
        for (; __end4 != pTVar8; __end4 = __end4 + 1) {
          backup_name.field_2._8_8_ = __end4;
          CompilerGLSL::add_member_name(&this->super_CompilerGLSL,type_00,__range4._4_4_);
          member_name.field_2._12_4_ =
               TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
          psVar9 = Compiler::get_member_name_abi_cxx11_
                             ((Compiler *)this,(TypeID)member_name.field_2._12_4_,__range4._4_4_);
          ::std::__cxx11::string::string((string *)local_2c8,(string *)psVar9);
          CompilerGLSL::to_member_name_abi_cxx11_
                    ((string *)local_2f0,&this->super_CompilerGLSL,type_00,__range4._4_4_);
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_330,this,(ulong)uVar3,1);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                    (&local_310,local_330,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66305e,
                     (char (*) [2])local_2f0,ts_2);
          ::std::__cxx11::string::operator=((string *)local_2f0,(string *)&local_310);
          ::std::__cxx11::string::~string((string *)&local_310);
          ::std::__cxx11::string::~string((string *)local_330);
          ParsedIR::sanitize_underscores((string *)local_2f0);
          local_334 = (uint32_t)
                      TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
          Compiler::set_member_name
                    ((Compiler *)this,(TypeID)local_334,__range4._4_4_,(string *)local_2f0);
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)backup_name.field_2._8_8_);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_358,"",(allocator *)((long)&failed_index_1 + 3));
          ts_2 = &local_358;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x15])
                    (this,type_00,(ulong)uVar3,(ulong)__range4._4_4_,ts_2,0);
          ::std::__cxx11::string::~string((string *)&local_358);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&failed_index_1 + 3));
          local_360 = (uint32_t)
                      TypedID::operator_cast_to_TypedID((TypedID *)&(type_00->super_IVariant).self);
          Compiler::set_member_name
                    ((Compiler *)this,(TypeID)local_360,__range4._4_4_,(string *)local_2c8);
          __range4._4_4_ = __range4._4_4_ + 1;
          ::std::__cxx11::string::~string((string *)local_2f0);
          ::std::__cxx11::string::~string((string *)local_2c8);
        }
        CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x65adc5);
        ::std::__cxx11::string::~string((string *)local_190);
      }
      else {
        if ((this->hlsl_options).shader_model < 0x33) {
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar10,
                     "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1."
                    );
          __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar3);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar3);
        local_364 = 0;
        bVar1 = CompilerGLSL::buffer_is_packing_standard
                          (&this->super_CompilerGLSL,type_00,BufferPackingHLSLCbuffer,&local_364,0,
                           0xffffffff);
        if (!bVar1) {
          local_3c9 = 1;
          pCVar10 = (CompilerError *)__cxa_allocate_exception(0x10);
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self)
          ;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_3a8,this,(ulong)uVar3,1);
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&local_3c8,&this->super_CompilerGLSL,type_00,local_364);
          join<char_const(&)[27],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[17],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[54]>
                    (&local_388,(spirv_cross *)"HLSL ConstantBuffer<T> ID ",
                     (char (*) [27])&(var->super_IVariant).self,
                     (TypedID<(spirv_cross::Types)0> *)" (name: ",(char (*) [9])local_3a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "), member index ",(char (*) [17])&local_364,(uint *)" (name: ",
                     (char (*) [9])&local_3c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ") cannot be expressed with normal HLSL packing rules.",
                     (char (*) [54])in_stack_fffffffffffffa38);
          CompilerError::CompilerError(pCVar10,&local_388);
          local_3c9 = 0;
          __cxa_throw(pCVar10,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        pSVar11 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
        CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar11);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_3f0,this,(ulong)uVar3,1);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_410,this,(ulong)uVar3,1);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                  (&local_430,this,type_00,(ulong)uVar3);
        to_resource_binding_abi_cxx11_(&local_450,this,var);
        CompilerGLSL::
        statement<char_const(&)[16],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [16])"ConstantBuffer<",&local_3f0,
                   (char (*) [3])0x681592,&local_410,&local_430,&local_450,(char (*) [2])0x6815db);
        ::std::__cxx11::string::~string((string *)&local_450);
        ::std::__cxx11::string::~string((string *)&local_430);
        ::std::__cxx11::string::~string((string *)&local_410);
        ::std::__cxx11::string::~string((string *)&local_3f0);
      }
    }
    else {
      ParsedIR::get_buffer_block_flags
                ((Bitset *)local_70,&(this->super_CompilerGLSL).super_Compiler.ir,var);
      bVar1 = Bitset::get((Bitset *)local_70,0x18);
      local_479 = 0;
      if (bVar1) {
        bVar1 = is_hlsl_force_storage_buffer_as_uav(this,(ID)(var->super_IVariant).self.id);
        local_479 = bVar1 ^ 0xff;
      }
      local_479 = local_479 & 1;
      bVar1 = Bitset::get((Bitset *)local_70,0x17);
      local_47c = 0;
      if (bVar1) {
        local_47c = local_479 ^ 0xff;
      }
      to_structuredbuffer_subtype_name.this._7_1_ = local_47c & 1;
      to_structuredbuffer_subtype_name.this._0_4_ =
           TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      sVar5 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                      (key_type *)&to_structuredbuffer_subtype_name);
      to_structuredbuffer_subtype_name.this._6_1_ = sVar5 != 0;
      type_name.field_2._8_8_ = this;
      ::std::__cxx11::string::string((string *)local_b8);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      uVar4 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])(this,(ulong)uVar3);
      if ((uVar4 & 1) == 0) {
        if (local_479 == 0) {
          local_4a8 = "RWByteAddressBuffer";
          if ((to_structuredbuffer_subtype_name.this._6_1_ & 1) != 0) {
            local_4a8 = "RasterizerOrderedByteAddressBuffer";
          }
        }
        else {
          local_4a8 = "ByteAddressBuffer";
        }
        ::std::__cxx11::string::operator=((string *)local_b8,local_4a8);
      }
      else {
        if (local_479 == 0) {
          local_4a0 = "RW";
          if ((to_structuredbuffer_subtype_name.this._6_1_ & 1) != 0) {
            local_4a0 = "RasterizerOrdered";
          }
        }
        else {
          local_4a0 = "";
        }
        local_e0 = local_4a0;
        emit_buffer_block(spirv_cross::SPIRVariable_const&)::$_0::operator()::SPIRType_const___const
                  (&local_100,(void *)((long)&type_name.field_2 + 8),type_00);
        join<char_const*,char_const(&)[18],std::__cxx11::string,char_const(&)[2]>
                  (&local_d8,(spirv_cross *)&local_e0,(char **)"StructuredBuffer<",
                   (char (*) [18])&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6747b7,
                   (char (*) [2])in_R9);
        ::std::__cxx11::string::operator=((string *)local_b8,(string *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_100);
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar3);
      local_108 = "";
      if ((to_structuredbuffer_subtype_name.this._7_1_ & 1) != 0) {
        local_108 = "globallycoherent ";
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_128,this,(ulong)uVar3,1)
      ;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                (&local_148,this,type_00,(ulong)uVar3);
      to_resource_binding_abi_cxx11_(&local_168,this,var);
      CompilerGLSL::
      statement<char_const*,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 (char (*) [2])0x645fd9,&local_128,&local_148,&local_168,(char (*) [2])0x6815db);
      ::std::__cxx11::string::~string((string *)&local_168);
      ::std::__cxx11::string::~string((string *)&local_148);
      ::std::__cxx11::string::~string((string *)&local_128);
      ::std::__cxx11::string::~string((string *)local_b8);
      Bitset::~Bitset((Bitset *)local_70);
    }
  }
  else {
    CompilerGLSL::emit_buffer_block_flattened(&this->super_CompilerGLSL,var);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_buffer_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	bool is_uav = var.storage == StorageClassStorageBuffer || has_decoration(type.self, DecorationBufferBlock);

	if (flattened_buffer_blocks.count(var.self))
	{
		emit_buffer_block_flattened(var);
	}
	else if (is_uav)
	{
		Bitset flags = ir.get_buffer_block_flags(var);
		bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
		bool is_coherent = flags.get(DecorationCoherent) && !is_readonly;
		bool is_interlocked = interlocked_resources.count(var.self) > 0;

		auto to_structuredbuffer_subtype_name = [this](const SPIRType &parent_type) -> std::string
		{
			if (parent_type.basetype == SPIRType::Struct && parent_type.member_types.size() == 1)
			{
				// Use type of first struct member as a StructuredBuffer will have only one '._m0' field in SPIR-V
				const auto &member0_type = this->get<SPIRType>(parent_type.member_types.front());
				return this->type_to_glsl(member0_type);
			}
			else
			{
				// Otherwise, this StructuredBuffer only has a basic subtype, e.g. StructuredBuffer<int>
				return this->type_to_glsl(parent_type);
			}
		};

		std::string type_name;
		if (is_user_type_structured(var.self))
			type_name = join(is_readonly ? "" : is_interlocked ? "RasterizerOrdered" : "RW", "StructuredBuffer<", to_structuredbuffer_subtype_name(type), ">");
		else
			type_name = is_readonly ? "ByteAddressBuffer" : is_interlocked ? "RasterizerOrderedByteAddressBuffer" : "RWByteAddressBuffer";

		add_resource_name(var.self);
		statement(is_coherent ? "globallycoherent " : "", type_name, " ", to_name(var.self), type_to_array_glsl(type, var.self),
		          to_resource_binding(var), ";");
	}
	else
	{
		if (type.array.empty())
		{
			// Flatten the top-level struct so we can use packoffset,
			// this restriction is similar to GLSL where layout(offset) is not possible on sub-structs.
			flattened_structs[var.self] = false;

			// Prefer the block name if possible.
			auto buffer_name = to_name(type.self, false);
			if (ir.meta[type.self].decoration.alias.empty() ||
			    resource_names.find(buffer_name) != end(resource_names) ||
			    block_names.find(buffer_name) != end(block_names))
			{
				buffer_name = get_block_fallback_name(var.self);
			}

			add_variable(block_names, resource_names, buffer_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (buffer_name.empty())
				buffer_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			uint32_t failed_index = 0;
			if (buffer_is_packing_standard(type, BufferPackingHLSLCbufferPackOffset, &failed_index))
				set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
			else
			{
				SPIRV_CROSS_THROW(join("cbuffer ID ", var.self, " (name: ", buffer_name, "), member index ",
				                       failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with either HLSL packing layout or packoffset."));
			}

			block_names.insert(buffer_name);

			// Save for post-reflection later.
			declared_block_names[var.self] = buffer_name;

			type.member_name_cache.clear();
			// var.self can be used as a backup name for the block name,
			// so we need to make sure we don't disturb the name here on a recompile.
			// It will need to be reset if we have to recompile.
			preserve_alias_on_reset(var.self);
			add_resource_name(var.self);
			statement("cbuffer ", buffer_name, to_resource_binding(var));
			begin_scope();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				auto backup_name = get_member_name(type.self, i);
				auto member_name = to_member_name(type, i);
				member_name = join(to_name(var.self), "_", member_name);
				ParsedIR::sanitize_underscores(member_name);
				set_member_name(type.self, i, member_name);
				emit_struct_member(type, member, i, "");
				set_member_name(type.self, i, backup_name);
				i++;
			}

			end_scope_decl();
			statement("");
		}
		else
		{
			if (hlsl_options.shader_model < 51)
				SPIRV_CROSS_THROW(
				    "Need ConstantBuffer<T> to use arrays of UBOs, but this is only supported in SM 5.1.");

			add_resource_name(type.self);
			add_resource_name(var.self);

			// ConstantBuffer<T> does not support packoffset, so it is unuseable unless everything aligns as we expect.
			uint32_t failed_index = 0;
			if (!buffer_is_packing_standard(type, BufferPackingHLSLCbuffer, &failed_index))
			{
				SPIRV_CROSS_THROW(join("HLSL ConstantBuffer<T> ID ", var.self, " (name: ", to_name(type.self),
				                       "), member index ", failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with normal HLSL packing rules."));
			}

			emit_struct(get<SPIRType>(type.self));
			statement("ConstantBuffer<", to_name(type.self), "> ", to_name(var.self), type_to_array_glsl(type, var.self),
			          to_resource_binding(var), ";");
		}
	}
}